

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallsList.cpp
# Opt level: O1

void __thiscall
MockExpectedCallsList::deleteAllExpectationsAndClearList(MockExpectedCallsList *this)

{
  MockExpectedCallsListNode *pMVar1;
  MockCheckedExpectedCall **ppMVar2;
  
  pMVar1 = this->head_;
  while (pMVar1 != (MockExpectedCallsListNode *)0x0) {
    ppMVar2 = &pMVar1->expectedCall_;
    pMVar1 = pMVar1->next_;
    if (*ppMVar2 != (MockCheckedExpectedCall *)0x0) {
      (*((*ppMVar2)->super_MockExpectedCall)._vptr_MockExpectedCall[1])();
    }
    if (this->head_ != (MockExpectedCallsListNode *)0x0) {
      operator_delete(this->head_,0x10);
    }
    this->head_ = pMVar1;
  }
  return;
}

Assistant:

void MockExpectedCallsList::deleteAllExpectationsAndClearList()
{
    while (head_) {
        MockExpectedCallsListNode* next = head_->next_;
        delete head_->expectedCall_;
        delete head_;
        head_ = next;
    }
}